

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void encode_quantization(CommonQuantParams *quant_params,int num_planes,_Bool separate_uv_delta_q,
                        aom_write_bit_buffer *wb)

{
  aom_write_bit_buffer *in_RCX;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  int diff_uv_delta;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined3 uVar1;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  
  aom_wb_write_literal
            ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  write_delta_q((aom_write_bit_buffer *)
                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                in_stack_ffffffffffffffdc);
  if (1 < in_ESI) {
    uVar1 = (undefined3)in_stack_ffffffffffffffe0;
    in_stack_ffffffffffffffe0 = CONCAT13(1,uVar1);
    if (*(int *)(in_RDI + 0xc) == *(int *)(in_RDI + 0x10)) {
      in_stack_ffffffffffffffe0 = CONCAT13(*(int *)(in_RDI + 0x14) != *(int *)(in_RDI + 0x18),uVar1)
      ;
    }
    in_stack_ffffffffffffffe4 = in_stack_ffffffffffffffe0 >> 0x18;
    if ((in_DL & 1) != 0) {
      aom_wb_write_bit(in_RCX,in_stack_ffffffffffffffe4);
    }
    write_delta_q((aom_write_bit_buffer *)
                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
    write_delta_q((aom_write_bit_buffer *)
                  CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  in_stack_ffffffffffffffdc);
    if (in_stack_ffffffffffffffe4 != 0) {
      write_delta_q((aom_write_bit_buffer *)
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc);
      write_delta_q((aom_write_bit_buffer *)
                    CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                    in_stack_ffffffffffffffdc);
    }
  }
  aom_wb_write_bit(in_RCX,(uint)(*(byte *)(in_RDI + 0x47c0) & 1));
  if ((*(byte *)(in_RDI + 0x47c0) & 1) != 0) {
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
               ,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
               ,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    if ((in_DL & 1) != 0) {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
    }
  }
  return;
}

Assistant:

static inline void encode_quantization(
    const CommonQuantParams *const quant_params, int num_planes,
    bool separate_uv_delta_q, struct aom_write_bit_buffer *wb) {
  aom_wb_write_literal(wb, quant_params->base_qindex, QINDEX_BITS);
  write_delta_q(wb, quant_params->y_dc_delta_q);
  if (num_planes > 1) {
    int diff_uv_delta =
        (quant_params->u_dc_delta_q != quant_params->v_dc_delta_q) ||
        (quant_params->u_ac_delta_q != quant_params->v_ac_delta_q);
    if (separate_uv_delta_q) aom_wb_write_bit(wb, diff_uv_delta);
    write_delta_q(wb, quant_params->u_dc_delta_q);
    write_delta_q(wb, quant_params->u_ac_delta_q);
    if (diff_uv_delta) {
      write_delta_q(wb, quant_params->v_dc_delta_q);
      write_delta_q(wb, quant_params->v_ac_delta_q);
    }
  }
  aom_wb_write_bit(wb, quant_params->using_qmatrix);
  if (quant_params->using_qmatrix) {
    aom_wb_write_literal(wb, quant_params->qmatrix_level_y, QM_LEVEL_BITS);
    aom_wb_write_literal(wb, quant_params->qmatrix_level_u, QM_LEVEL_BITS);
    if (!separate_uv_delta_q)
      assert(quant_params->qmatrix_level_u == quant_params->qmatrix_level_v);
    else
      aom_wb_write_literal(wb, quant_params->qmatrix_level_v, QM_LEVEL_BITS);
  }
}